

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O0

void __thiscall cmLoadCacheCommand::CheckLine(cmLoadCacheCommand *this,char *line)

{
  cmMakefile *this_00;
  bool bVar1;
  ulong uVar2;
  char *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Self local_a8;
  _Self local_a0 [3];
  allocator<char> local_81;
  string local_80;
  CacheEntryType local_5c;
  undefined1 local_58 [4];
  CacheEntryType type;
  string value;
  string var;
  char *line_local;
  cmLoadCacheCommand *this_local;
  
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  local_5c = UNINITIALIZED;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,line,&local_81);
  bVar1 = cmake::ParseCacheEntry
                    (&local_80,(string *)((long)&value.field_2 + 8),(string *)local_58,&local_5c);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  if (bVar1) {
    local_a0[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->VariablesToRead,(key_type *)((long)&value.field_2 + 8));
    local_a8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->VariablesToRead);
    bVar1 = std::operator!=(local_a0,&local_a8);
    if (bVar1) {
      std::operator+(&local_c8,&this->Prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&value.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(value.field_2._M_local_buf + 8),(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        this_00 = (this->super_cmCommand).Makefile;
        value_00 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(this_00,(string *)((long)&value.field_2 + 8),value_00);
      }
      else {
        cmMakefile::RemoveDefinition
                  ((this->super_cmCommand).Makefile,(string *)((long)&value.field_2 + 8));
      }
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLoadCacheCommand::CheckLine(const char* line)
{
  // Check one line of the cache file.
  std::string var;
  std::string value;
  cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
  if (cmake::ParseCacheEntry(line, var, value, type)) {
    // Found a real entry.  See if this one was requested.
    if (this->VariablesToRead.find(var) != this->VariablesToRead.end()) {
      // This was requested.  Set this variable locally with the given
      // prefix.
      var = this->Prefix + var;
      if (!value.empty()) {
        this->Makefile->AddDefinition(var, value.c_str());
      } else {
        this->Makefile->RemoveDefinition(var);
      }
    }
  }
}